

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageCommand.cxx
# Opt level: O3

cmCTestGenericHandler * __thiscall
cmCTestCoverageCommand::InitializeHandler(cmCTestCoverageCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  cmCTest *pcVar3;
  cmCTestCoverageHandler *this_00;
  string local_40;
  
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CTEST_COVERAGE_COMMAND","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar3,pcVar2,"CoverageCommand",&local_40,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"CTEST_COVERAGE_EXTRA_FLAGS","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar3,pcVar2,"CoverageExtraFlags",&local_40,(this->super_cmCTestHandlerCommand).Quiet)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  this_00 = cmCTest::GetCoverageHandler
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(this_00->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])(this_00);
  if (this->LabelsMentioned == true) {
    cmCTestCoverageHandler::SetLabelFilter(this_00,&this->Labels);
  }
  (this_00->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  return &this_00->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestCoverageCommand::InitializeHandler()
{
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CoverageCommand", "CTEST_COVERAGE_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CoverageExtraFlags", "CTEST_COVERAGE_EXTRA_FLAGS",
    this->Quiet);
  cmCTestCoverageHandler* handler = this->CTest->GetCoverageHandler();
  handler->Initialize();

  // If a LABELS option was given, select only files with the labels.
  if (this->LabelsMentioned) {
    handler->SetLabelFilter(this->Labels);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}